

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RangeCoverageBinInitializerSyntax::setChild
          (RangeCoverageBinInitializerSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  WithClauseSyntax *local_40;
  RangeListSyntax *local_38;
  RangeListSyntax *local_20;
  not_null<slang::syntax::RangeListSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4aedfa);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_38 = (RangeListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4aee0a);
      local_38 = SyntaxNode::as<slang::syntax::RangeListSyntax>(pSVar1);
    }
    local_20 = local_38;
    not_null<slang::syntax::RangeListSyntax_*>::not_null<slang::syntax::RangeListSyntax_*>
              (local_18,&local_20);
    *(RangeListSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4aee55);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (WithClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4aee65);
      local_40 = SyntaxNode::as<slang::syntax::WithClauseSyntax>(pSVar1);
    }
    *(WithClauseSyntax **)(in_RDI + 0x20) = local_40;
  }
  return;
}

Assistant:

void RangeCoverageBinInitializerSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        case 1: withClause = child.node() ? &child.node()->as<WithClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}